

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall helics::BrokerBase::saveProfilingData(BrokerBase *this,string_view message)

{
  ProfilerBuffer *this_00;
  string_view name;
  string local_38;
  
  this_00 = (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (ProfilerBuffer *)0x0) {
    name._M_str = "[PROFILING]";
    name._M_len = 0xb;
    sendToLogger(this,(GlobalFederateId)0x0,2,name,message,false);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,message._M_str,message._M_str + message._M_len);
    ProfilerBuffer::addMessage(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void BrokerBase::saveProfilingData(std::string_view message)
{
    if (prBuff) {
        prBuff->addMessage(std::string(message));
    } else {
        sendToLogger(parent_broker_id, LogLevels::PROFILING, "[PROFILING]", message);
    }
}